

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  Location loc_00;
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  string end_label;
  Location loc;
  
  GetLocation(&loc,this);
  end_label._M_dataplus._M_p = (pointer)&end_label.field_2;
  end_label._M_string_length = 0;
  end_label.field_2._M_local_buf[0] = '\0';
  RVar2 = ParseLabelOpt(this,&end_label);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    EVar3 = Ok;
    if (end_label._M_string_length != 0) {
      if (begin_label->_M_string_length == 0) {
        EVar3 = Ok;
        Error(this,0x1676c5,end_label._M_dataplus._M_p);
      }
      else {
        bVar1 = std::operator!=(begin_label,&end_label);
        EVar3 = Ok;
        if (bVar1) {
          EVar3 = Ok;
          loc_00.filename._M_len._4_4_ = loc.filename._M_len._4_4_;
          loc_00.filename._M_len._0_4_ = (undefined4)loc.filename._M_len;
          loc_00.filename._M_str._0_4_ = loc.filename._M_str._0_4_;
          loc_00.filename._M_str._4_4_ = loc.filename._M_str._4_4_;
          loc_00.field_1.field_0.line = loc.field_1.field_0.line;
          loc_00.field_1.field_0.first_column = loc.field_1.field_0.first_column;
          loc_00.field_1.field_0.last_column = loc.field_1.field_0.last_column;
          loc_00.field_1._12_4_ = loc.field_1._12_4_;
          Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",(begin_label->_M_dataplus)._M_p,
                end_label._M_dataplus._M_p,in_R8,in_R9);
        }
      }
    }
  }
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}